

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O3

MOJOSHADER_glShader *
MOJOSHADER_glCompileShader
          (uchar *tokenbuf,uint bufsize,MOJOSHADER_swizzle *swiz,uint swizcount,
          MOJOSHADER_samplerMap *smap,uint smapcount)

{
  int iVar1;
  MOJOSHADER_parseData *_data;
  MOJOSHADER_glShader *pMVar2;
  GLuint shader;
  GLuint local_14;
  
  local_14 = 0;
  _data = MOJOSHADER_parse(ctx->profile,(char *)0x0,tokenbuf,bufsize,swiz,swizcount,smap,smapcount,
                           ctx->malloc_fn,ctx->free_fn,ctx->malloc_data);
  if (_data->error_count < 1) {
    pMVar2 = (MOJOSHADER_glShader *)(*ctx->malloc_fn)(0x10,ctx->malloc_data);
    if (pMVar2 != (MOJOSHADER_glShader *)0x0) {
      iVar1 = (*ctx->profileCompileShader)(_data,&local_14);
      if (iVar1 != 0) {
        pMVar2->parseData = _data;
        pMVar2->handle = local_14;
        pMVar2->refcount = 1;
        return pMVar2;
      }
      MOJOSHADER_freeParseData(_data);
      (*ctx->free_fn)(pMVar2,ctx->malloc_data);
      if (local_14 == 0) {
        return (MOJOSHADER_glShader *)0x0;
      }
      (*ctx->profileDeleteShader)(local_14);
      return (MOJOSHADER_glShader *)0x0;
    }
    builtin_strncpy(error_buffer + 8,"emory",6);
    builtin_strncpy(error_buffer,"out of m",8);
  }
  else {
    snprintf(error_buffer,0x400,"%s",_data->errors->error);
  }
  MOJOSHADER_freeParseData(_data);
  return (MOJOSHADER_glShader *)0x0;
}

Assistant:

MOJOSHADER_glShader *MOJOSHADER_glCompileShader(const unsigned char *tokenbuf,
                                                const unsigned int bufsize,
                                                const MOJOSHADER_swizzle *swiz,
                                                const unsigned int swizcount,
                                                const MOJOSHADER_samplerMap *smap,
                                                const unsigned int smapcount)
{
    MOJOSHADER_glShader *retval = NULL;
    GLuint shader = 0;

    // This doesn't need a mainfn, since there's no GL lang that does.
    const MOJOSHADER_parseData *pd = MOJOSHADER_parse(ctx->profile, NULL,
                                                      tokenbuf, bufsize,
                                                      swiz, swizcount,
                                                      smap, smapcount,
                                                      ctx->malloc_fn,
                                                      ctx->free_fn,
                                                      ctx->malloc_data);
    if (pd->error_count > 0)
    {
        // !!! FIXME: put multiple errors in the buffer? Don't use
        // !!! FIXME:  MOJOSHADER_glGetError() for this?
        set_error(pd->errors[0].error);
        goto compile_shader_fail;
    } // if

    retval = (MOJOSHADER_glShader *) Malloc(sizeof (MOJOSHADER_glShader));
    if (retval == NULL)
        goto compile_shader_fail;

    if (!ctx->profileCompileShader(pd, &shader))
        goto compile_shader_fail;

    retval->parseData = pd;
    retval->handle = shader;
    retval->refcount = 1;
    return retval;

compile_shader_fail:
    MOJOSHADER_freeParseData(pd);
    Free(retval);
    if (shader != 0)
        ctx->profileDeleteShader(shader);
    return NULL;
}